

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

bool IsUnixSocketPath(string *name)

{
  size_type sVar1;
  long in_FS_OFFSET;
  bool bVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (name,ADDR_PREFIX_UNIX_abi_cxx11_._M_dataplus._M_p,0,
                     ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length);
  if (sVar1 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,name,ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length,0xffffffffffffffff);
    bVar2 = local_38._M_string_length + 1 < 0x6d;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsUnixSocketPath(const std::string& name)
{
#ifdef HAVE_SOCKADDR_UN
    if (name.find(ADDR_PREFIX_UNIX) != 0) return false;

    // Split off "unix:" prefix
    std::string str{name.substr(ADDR_PREFIX_UNIX.length())};

    // Path size limit is platform-dependent
    // see https://manpages.ubuntu.com/manpages/xenial/en/man7/unix.7.html
    if (str.size() + 1 > sizeof(((sockaddr_un*)nullptr)->sun_path)) return false;

    return true;
#else
    return false;
#endif
}